

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

int lyp_yin_parse_complex_ext
              (lys_module *mod,lys_ext_instance_complex *ext,lyxml_elem *yin,unres_schema *unres)

{
  long lVar1;
  lyxml_elem *plVar2;
  lyxml_ns *plVar3;
  LY_STMT *pLVar4;
  lyxml_elem *node;
  int iVar5;
  LY_ERR *pLVar6;
  lys_tpdf *tpdf;
  lys_iffeature *iffeat;
  undefined4 *puVar7;
  ushort **ppuVar8;
  lys_when *plVar9;
  lys_revision *rev;
  lys_unique *unique;
  lys_node **pplVar10;
  lys_module *plVar11;
  void **ppvVar12;
  lys_restr *must;
  char *pcVar13;
  void *pvVar14;
  size_t sVar15;
  undefined2 uVar16;
  LY_STMT LVar17;
  LYS_NODE type;
  LY_ECODE LVar18;
  ly_ctx *plVar19;
  LYEXT_SUBSTMT type_00;
  lyext_substmt *plVar20;
  char *pcVar21;
  ulong uVar22;
  lyext_substmt *plVar23;
  uint uVar24;
  long lVar25;
  lyxml_elem *elem;
  uint16_t mask;
  uint16_t val1;
  uint16_t val2;
  lyext_substmt *local_80;
  char *local_78;
  char *endptr;
  lyext_substmt *local_68;
  lyext_substmt *info;
  undefined1 local_51;
  lyext_substmt *local_50;
  unres_schema *local_48;
  lys_node *local_40;
  lyext_substmt *local_38;
  
  node = yin->child;
  local_48 = unres;
  do {
    while( true ) {
      local_40 = (lys_node *)ext;
      if (node == (lyxml_elem *)0x0) {
        if ((((lys_node *)ext)->parent != (lys_node *)0x0) &&
           (iVar5 = lyp_mand_check_ext(ext,yin->name), iVar5 != 0)) {
          return 1;
        }
        return 0;
      }
      plVar2 = node->next;
      plVar3 = node->ns;
      if (plVar3 != (lyxml_ns *)0x0) break;
LAB_00130c1a:
      lyxml_free(mod->ctx,node);
      node = plVar2;
      ext = (lys_ext_instance_complex *)local_40;
    }
    if (((plVar3 == yin->ns) && ((((lys_node *)ext)->flags & 1) != 0)) &&
       (plVar20 = (lyext_substmt *)node->name,
       plVar20 == (lyext_substmt *)((lys_ext *)((lys_node *)ext)->name)->argument)) {
      if (((lys_node *)ext)->ref != (char *)0x0) {
        plVar19 = mod->ctx;
LAB_00132363:
        pcVar13 = yin->name;
        LVar18 = LYE_TOOMANY;
        goto LAB_00132370;
      }
      ((lys_node *)ext)->ref = node->content;
      node->content = (char *)0x0;
      goto LAB_00130c1a;
    }
    iVar5 = strcmp(plVar3->value,"urn:ietf:params:xml:ns:yang:yin:1");
    if (iVar5 != 0) {
      iVar5 = lyp_yin_parse_subnode_ext
                        (mod,ext,LYEXT_PAR_EXTINST,node,LYEXT_SUBSTMT_SELF,'\0',local_48);
LAB_001306b3:
      if (iVar5 != 0) {
        return 1;
      }
      goto LAB_00130c1a;
    }
    pcVar13 = node->name;
    iVar5 = strcmp(pcVar13,"description");
    if (iVar5 == 0) {
      LVar17 = LY_STMT_DESCRIPTION;
LAB_00130be4:
      iVar5 = 1;
      pcVar13 = "text";
LAB_00130bf1:
      iVar5 = yin_parse_extcomplex_str(mod,node,ext,LVar17,iVar5,pcVar13,local_48);
LAB_00130bf6:
      if (iVar5 != 0) {
        return 1;
      }
      goto LAB_00130c1a;
    }
    iVar5 = strcmp(pcVar13,"reference");
    if (iVar5 == 0) {
      LVar17 = LY_STMT_REFERENCE;
      goto LAB_00130be4;
    }
    iVar5 = strcmp(pcVar13,"units");
    if (iVar5 == 0) {
      LVar17 = LY_STMT_UNITS;
LAB_00130c4c:
      pcVar13 = "name";
      goto LAB_00130c56;
    }
    iVar5 = strcmp(pcVar13,"type");
    if (iVar5 != 0) {
      iVar5 = strcmp(pcVar13,"typedef");
      if (iVar5 != 0) {
        iVar5 = strcmp(pcVar13,"if-feature");
        if (iVar5 == 0) {
          ppvVar12 = yin_getplace_for_extcomplex_struct(node,ext,LY_STMT_IFFEATURE);
          if (ppvVar12 == (void **)0x0) {
            return 1;
          }
          iffeat = (lys_iffeature *)calloc(1,0x20);
          *ppvVar12 = iffeat;
          if (iffeat == (lys_iffeature *)0x0) goto LAB_0013238f;
          iVar5 = fill_yin_iffeature(local_40,0,node,iffeat,local_48);
          goto LAB_00130bf6;
        }
        iVar5 = strcmp(pcVar13,"status");
        if (iVar5 == 0) {
          local_38 = (lyext_substmt *)
                     yin_getplace_for_extcomplex_flags(node,ext,LY_STMT_STATUS,0x38);
          if (local_38 == (lyext_substmt *)0x0) {
            return 1;
          }
          pcVar13 = lyxml_get_attr(node,"value",(char *)0x0);
          if ((lyext_substmt *)pcVar13 == (lyext_substmt *)0x0) {
            plVar19 = mod->ctx;
            pcVar21 = node->name;
LAB_001323c4:
            pcVar13 = "value";
            LVar18 = LYE_MISSARG;
LAB_001323e9:
            ly_vlog(plVar19,LVar18,LY_VLOG_NONE,(void *)0x0,pcVar13,pcVar21);
            return 1;
          }
          iVar5 = strcmp(pcVar13,"current");
          if (iVar5 == 0) {
            uVar16 = LY_STMT_ERRMSG;
          }
          else {
            iVar5 = strcmp(pcVar13,"deprecated");
            if (iVar5 == 0) {
              uVar16 = LY_STMT_REVISIONDATE;
            }
            else {
              iVar5 = strcmp(pcVar13,"obsolete");
              uVar16 = LY_STMT_MODULE;
              if (iVar5 != 0) {
                plVar19 = mod->ctx;
                pcVar21 = node->name;
                LVar18 = LYE_INARG;
                goto LAB_001323e9;
              }
            }
          }
          *(short *)&local_38->stmt = (short)local_38->stmt | uVar16;
          iVar5 = lyp_yin_parse_subnode_ext
                            (mod,local_40,LYEXT_PAR_EXTINST,node,LYEXT_SUBSTMT_STATUS,'\0',local_48)
          ;
          goto LAB_00130bf6;
        }
        iVar5 = strcmp(pcVar13,"config");
        if (iVar5 == 0) {
          val2 = 6;
          val1 = 5;
          mask = 3;
LAB_00130e41:
          LVar17 = LY_STMT_MANDATORY;
          pcVar13 = "true";
          pcVar21 = "false";
LAB_00130e5d:
          iVar5 = yin_parse_extcomplex_flag
                            (mod,node,ext,LVar17,pcVar13,pcVar21,mask,val1,val2,local_48);
          goto LAB_001306b3;
        }
        iVar5 = strcmp(pcVar13,"argument");
        if (iVar5 != 0) {
          iVar5 = strcmp(pcVar13,"default");
          if (iVar5 == 0) {
            LVar17 = LY_STMT_DEFAULT;
LAB_00130fe6:
            pcVar13 = "value";
LAB_00130c56:
            iVar5 = yin_parse_extcomplex_str(mod,node,ext,LVar17,0,pcVar13,local_48);
            goto LAB_001306b3;
          }
          iVar5 = strcmp(pcVar13,"mandatory");
          if (iVar5 == 0) {
            val2 = 0x80;
            val1 = 0x40;
            mask = 0xc0;
            goto LAB_00130e41;
          }
          iVar5 = strcmp(pcVar13,"error-app-tag");
          if (iVar5 == 0) {
            LVar17 = LY_STMT_ERRTAG;
            goto LAB_00130fe6;
          }
          iVar5 = strcmp(pcVar13,"error-message");
          if (iVar5 == 0) {
            LVar17 = LY_STMT_ERRMSG;
            iVar5 = 1;
            pcVar13 = "value";
            goto LAB_00130bf1;
          }
          iVar5 = strcmp(pcVar13,"prefix");
          if (iVar5 == 0) {
            LVar17 = LY_STMT_PREFIX;
            goto LAB_00130fe6;
          }
          iVar5 = strcmp(pcVar13,"namespace");
          if (iVar5 == 0) {
            LVar17 = LY_STMT_NAMESPACE;
            pcVar13 = "uri";
            goto LAB_00130c56;
          }
          iVar5 = strcmp(pcVar13,"presence");
          if (iVar5 == 0) {
            LVar17 = LY_STMT_PRESENCE;
            goto LAB_00130fe6;
          }
          iVar5 = strcmp(pcVar13,"revision-date");
          if (iVar5 == 0) {
            LVar17 = LY_STMT_REVISIONDATE;
            pcVar13 = "date";
            goto LAB_00130c56;
          }
          iVar5 = strcmp(pcVar13,"key");
          if (iVar5 == 0) {
            LVar17 = LY_STMT_KEY;
            goto LAB_00130fe6;
          }
          iVar5 = strcmp(pcVar13,"base");
          if (iVar5 == 0) {
            LVar17 = LY_STMT_BASE;
            goto LAB_00130c4c;
          }
          iVar5 = strcmp(pcVar13,"ordered-by");
          if (iVar5 == 0) {
            val1 = 0x100;
            mask = 0x100;
            val2 = 0;
            LVar17 = LY_STMT_ORDEREDBY;
            pcVar13 = "user";
            pcVar21 = "system";
            goto LAB_00130e5d;
          }
          iVar5 = strcmp(pcVar13,"belongs-to");
          if (iVar5 == 0) {
            LVar17 = LY_STMT_BELONGSTO;
            pcVar13 = "module";
            goto LAB_00130c56;
          }
          iVar5 = strcmp(pcVar13,"contact");
          if (iVar5 == 0) {
            LVar17 = LY_STMT_CONTACT;
          }
          else {
            iVar5 = strcmp(pcVar13,"organization");
            if (iVar5 != 0) {
              iVar5 = strcmp(pcVar13,"path");
              if (iVar5 == 0) {
                LVar17 = LY_STMT_PATH;
                ext = (lys_ext_instance_complex *)local_40;
                goto LAB_00130fe6;
              }
              iVar5 = strcmp(pcVar13,"require-instance");
              if (iVar5 == 0) {
                LVar17 = LY_STMT_REQINSTANCE;
                pcVar13 = "true";
                pcVar21 = "false";
              }
              else {
                iVar5 = strcmp(pcVar13,"modifier");
                if (iVar5 != 0) {
                  iVar5 = strcmp(pcVar13,"fraction-digits");
                  if (iVar5 == 0) {
                    local_38 = (lyext_substmt *)
                               lys_ext_complex_get_substmt
                                         (LY_STMT_DIGITS,(lys_ext_instance_complex *)local_40,
                                          &local_68);
                    if (local_38 == (lyext_substmt *)0x0) goto LAB_0013240b;
                    if (LY_STMT_CARD_MAND < local_68->cardinality) {
                      pvVar14 = *(void **)local_38;
                      if (pvVar14 != (void *)0x0) {
                        lVar25 = 0;
                        do {
                          pcVar13 = (char *)((long)pvVar14 + lVar25);
                          lVar25 = lVar25 + 1;
                        } while (*pcVar13 != '\0');
                        uVar24 = (int)lVar25 - 1;
LAB_001312d2:
                        local_50 = local_38;
                        local_38 = (lyext_substmt *)((ulong)uVar24 + (long)pvVar14);
                        goto LAB_001312e4;
                      }
                      pvVar14 = malloc(2);
                      *(void **)local_38 = pvVar14;
                      if (pvVar14 != (void *)0x0) {
                        uVar24 = 0;
                        goto LAB_001312d2;
                      }
LAB_001323f2:
                      plVar19 = mod->ctx;
LAB_001323a0:
                      ly_log(plVar19,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                             "lyp_yin_parse_complex_ext");
                      return 1;
                    }
                    if ((char)local_38->stmt != LY_STMT_UNKNOWN) {
LAB_00132454:
                      plVar19 = mod->ctx;
                      yin = node->parent;
                      plVar20 = (lyext_substmt *)node->name;
                      goto LAB_00132363;
                    }
                    local_50 = (lyext_substmt *)0x0;
                    uVar24 = 0;
LAB_001312e4:
                    info = (lyext_substmt *)lyxml_get_attr(node,"value",(char *)0x0);
                    if (info != (lyext_substmt *)0x0) {
                      lVar25 = strtol((char *)info,(char **)0x0,10);
                      if (lVar25 - 0x13U < 0xffffffffffffffee) {
                        plVar19 = mod->ctx;
                        pcVar13 = node->name;
                        LVar18 = LYE_INARG;
                        plVar20 = info;
                        goto LAB_00132370;
                      }
                      iVar5 = lyp_yin_parse_subnode_ext
                                        (mod,local_40,LYEXT_PAR_EXTINST,node,LYEXT_SUBSTMT_STATUS,
                                         (uint8_t)uVar24,local_48);
                      if (iVar5 != 0) {
                        return 1;
                      }
                      *(char *)&local_38->stmt = (char)lVar25;
                      if (local_50 != (lyext_substmt *)0x0) {
                        pvVar14 = realloc(*(void **)local_50,(long)(int)uVar24 * 8 + 0x10);
                        if (pvVar14 == (void *)0x0) goto LAB_001323f2;
                        *(void **)local_50 = pvVar14;
                        *(undefined1 *)((long)pvVar14 + (long)(int)uVar24 + 1) = 0;
                      }
                      goto LAB_00130c1a;
                    }
LAB_00132424:
                    plVar19 = mod->ctx;
                  }
                  else {
                    iVar5 = strcmp(pcVar13,"max-elements");
                    if (iVar5 == 0) {
                      local_38 = (lyext_substmt *)
                                 lys_ext_complex_get_substmt
                                           (LY_STMT_MAX,(lys_ext_instance_complex *)local_40,
                                            &local_68);
                      if (local_38 == (lyext_substmt *)0x0) goto LAB_0013240b;
                      pvVar14 = *(void **)local_38;
                      if (local_68->cardinality < LY_STMT_CARD_SOME) {
                        if (pvVar14 != (void *)0x0) goto LAB_00132454;
                        local_50 = (lyext_substmt *)0x0;
                        uVar24 = 0;
                      }
                      else {
                        if (pvVar14 == (void *)0x0) {
                          pvVar14 = malloc(0x10);
                          *(void **)local_38 = pvVar14;
                          if (pvVar14 == (void *)0x0) goto LAB_001323f2;
                          uVar24 = 0;
                        }
                        else {
                          lVar25 = 0;
                          do {
                            lVar1 = lVar25 * 8;
                            lVar25 = lVar25 + 1;
                          } while (*(long *)((long)pvVar14 + lVar1) != 0);
                          uVar24 = (int)lVar25 - 1;
                        }
                        local_50 = local_38;
                        local_38 = (lyext_substmt *)((long)pvVar14 + (ulong)uVar24 * 8);
                      }
                      pcVar13 = lyxml_get_attr(node,"value",(char *)0x0);
                      if (pcVar13 != (char *)0x0) {
                        ppuVar8 = __ctype_b_loc();
                        plVar20 = (lyext_substmt *)(pcVar13 + -1);
                        do {
                          pLVar4 = &plVar20->stmt;
                          plVar20 = (lyext_substmt *)((long)&plVar20->stmt + 1);
                        } while ((*(byte *)((long)*ppuVar8 +
                                           (long)(char)*(byte *)((long)pLVar4 + 1) * 2 + 1) & 0x20)
                                 != 0);
                        iVar5 = strcmp((char *)plVar20,"unbounded");
                        if (iVar5 == 0) {
                          info = (lyext_substmt *)0x0;
                        }
                        else {
                          endptr = (char *)__errno_location();
                          *(int *)endptr = 0;
                          local_78 = (char *)0x0;
                          info = (lyext_substmt *)strtoul((char *)plVar20,&local_78,10);
                          if (((*local_78 != '\0') || ((char)plVar20->stmt == LY_STMT_OUTPUT)) ||
                             ((*(int *)endptr != 0 ||
                              (&info[-0xaaaaaab].offset < (size_t *)0xffffffff00000001))))
                          goto LAB_0013243c;
                        }
LAB_0013162a:
                        type_00 = LYEXT_SUBSTMT_MAX;
LAB_0013164b:
                        iVar5 = lyp_yin_parse_subnode_ext
                                          (mod,local_40,LYEXT_PAR_EXTINST,node,type_00,
                                           (uint8_t)uVar24,local_48);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        puVar7 = (undefined4 *)malloc(4);
                        *(undefined4 **)local_38 = puVar7;
                        if (puVar7 == (undefined4 *)0x0) goto LAB_001323f2;
                        *puVar7 = (int)info;
                        if (local_50 == (lyext_substmt *)0x0) goto LAB_00130c1a;
                        pvVar14 = *(void **)local_50;
LAB_0013168d:
                        lVar25 = (long)(int)uVar24;
                        pvVar14 = realloc(pvVar14,lVar25 * 8 + 0x10);
                        local_80 = local_50;
                        goto joined_r0x00131a2e;
                      }
                      goto LAB_00132424;
                    }
                    iVar5 = strcmp(pcVar13,"min-elements");
                    if (iVar5 == 0) {
                      local_38 = (lyext_substmt *)
                                 lys_ext_complex_get_substmt
                                           (LY_STMT_MIN,(lys_ext_instance_complex *)local_40,
                                            &local_68);
                      if (local_38 != (lyext_substmt *)0x0) {
                        pvVar14 = *(void **)local_38;
                        if (local_68->cardinality < LY_STMT_CARD_SOME) {
                          if (pvVar14 != (void *)0x0) goto LAB_00132454;
                          local_50 = (lyext_substmt *)0x0;
                          uVar24 = 0;
                        }
                        else {
                          if (pvVar14 == (void *)0x0) {
                            pvVar14 = malloc(0x10);
                            *(void **)local_38 = pvVar14;
                            if (pvVar14 == (void *)0x0) goto LAB_001323f2;
                            uVar24 = 0;
                          }
                          else {
                            lVar25 = 0;
                            do {
                              lVar1 = lVar25 * 8;
                              lVar25 = lVar25 + 1;
                            } while (*(long *)((long)pvVar14 + lVar1) != 0);
                            uVar24 = (int)lVar25 - 1;
                          }
                          local_50 = local_38;
                          local_38 = (lyext_substmt *)((long)pvVar14 + (ulong)uVar24 * 8);
                        }
                        pcVar13 = lyxml_get_attr(node,"value",(char *)0x0);
                        if (pcVar13 != (char *)0x0) {
                          ppuVar8 = __ctype_b_loc();
                          plVar20 = (lyext_substmt *)(pcVar13 + -1);
                          do {
                            pLVar4 = &plVar20->stmt;
                            plVar20 = (lyext_substmt *)((long)&plVar20->stmt + 1);
                          } while ((*(byte *)((long)*ppuVar8 +
                                             (long)(char)*(byte *)((long)pLVar4 + 1) * 2 + 1) & 0x20
                                   ) != 0);
                          endptr = (char *)__errno_location();
                          *(int *)endptr = 0;
                          local_78 = (char *)0x0;
                          info = (lyext_substmt *)strtoul((char *)plVar20,&local_78,10);
                          if (((*local_78 != '\0') || ((char)plVar20->stmt == LY_STMT_OUTPUT)) ||
                             ((*(int *)endptr != 0 || ((ulong)info >> 0x20 != 0)))) {
LAB_0013243c:
                            plVar19 = mod->ctx;
                            pcVar13 = node->name;
                            LVar18 = LYE_INARG;
                            goto LAB_00132370;
                          }
                          goto LAB_0013162a;
                        }
                        goto LAB_00132424;
                      }
LAB_0013240b:
                      plVar19 = mod->ctx;
                      plVar20 = (lyext_substmt *)node->name;
                      pcVar13 = node->parent->name;
                      LVar18 = LYE_INCHILDSTMT;
                      goto LAB_00132370;
                    }
                    iVar5 = strcmp(pcVar13,"value");
                    if (iVar5 == 0) {
                      local_38 = (lyext_substmt *)
                                 lys_ext_complex_get_substmt
                                           (LY_STMT_VALUE,(lys_ext_instance_complex *)local_40,
                                            &local_68);
                      if (local_38 != (lyext_substmt *)0x0) {
                        pvVar14 = *(void **)local_38;
                        if (local_68->cardinality < LY_STMT_CARD_SOME) {
                          if (pvVar14 != (void *)0x0) goto LAB_00132454;
                          local_50 = (lyext_substmt *)0x0;
                          uVar22 = 0;
                        }
                        else {
                          if (pvVar14 == (void *)0x0) {
                            pvVar14 = malloc(0x10);
                            *(void **)local_38 = pvVar14;
                            if (pvVar14 == (void *)0x0) goto LAB_001323f2;
                            uVar22 = 0;
                          }
                          else {
                            lVar25 = 0;
                            do {
                              lVar1 = lVar25 * 8;
                              lVar25 = lVar25 + 1;
                            } while (*(long *)((long)pvVar14 + lVar1) != 0);
                            uVar22 = (ulong)((int)lVar25 - 1);
                          }
                          local_50 = local_38;
                          local_38 = (lyext_substmt *)((long)pvVar14 + uVar22 * 8);
                        }
                        uVar24 = (uint)uVar22;
                        pcVar13 = lyxml_get_attr(node,"value",(char *)0x0);
                        if (pcVar13 == (char *)0x0) goto LAB_00132424;
                        ppuVar8 = __ctype_b_loc();
                        plVar20 = (lyext_substmt *)(pcVar13 + -1);
                        do {
                          pLVar4 = &plVar20->stmt;
                          plVar20 = (lyext_substmt *)((long)&plVar20->stmt + 1);
                        } while ((*(byte *)((long)*ppuVar8 +
                                           (long)(char)*(byte *)((long)pLVar4 + 1) * 2 + 1) & 0x20)
                                 != 0);
                        info = (lyext_substmt *)strtoll((char *)plVar20,(char **)0x0,10);
                        if ((lyext_substmt *)(long)(int)info != info) {
                          plVar19 = mod->ctx;
                          pcVar13 = node->name;
                          LVar18 = LYE_INARG;
                          goto LAB_00132370;
                        }
                        iVar5 = lyp_yin_parse_subnode_ext
                                          (mod,local_40,LYEXT_PAR_EXTINST,node,LYEXT_SUBSTMT_VALUE,
                                           (uint8_t)uVar22,local_48);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        puVar7 = (undefined4 *)malloc(4);
                        *(undefined4 **)local_38 = puVar7;
                        if (puVar7 == (undefined4 *)0x0) goto LAB_001323f2;
                        *puVar7 = (int)info;
LAB_001317d5:
                        if (local_50 == (lyext_substmt *)0x0) goto LAB_00130c1a;
                        pvVar14 = *(void **)local_50;
                        goto LAB_0013168d;
                      }
                      goto LAB_0013240b;
                    }
                    iVar5 = strcmp(pcVar13,"position");
                    if (iVar5 == 0) {
                      local_38 = (lyext_substmt *)
                                 lys_ext_complex_get_substmt
                                           (LY_STMT_POSITION,(lys_ext_instance_complex *)local_40,
                                            &local_68);
                      if (local_38 != (lyext_substmt *)0x0) {
                        pvVar14 = *(void **)local_38;
                        if (local_68->cardinality < LY_STMT_CARD_SOME) {
                          if (pvVar14 != (void *)0x0) goto LAB_00132454;
                          local_50 = (lyext_substmt *)0x0;
                          uVar24 = 0;
                        }
                        else {
                          if (pvVar14 == (void *)0x0) {
                            pvVar14 = malloc(0x10);
                            *(void **)local_38 = pvVar14;
                            if (pvVar14 == (void *)0x0) goto LAB_001323f2;
                            uVar24 = 0;
                          }
                          else {
                            lVar25 = 0;
                            do {
                              lVar1 = lVar25 * 8;
                              lVar25 = lVar25 + 1;
                            } while (*(long *)((long)pvVar14 + lVar1) != 0);
                            uVar24 = (int)lVar25 - 1;
                          }
                          local_50 = local_38;
                          local_38 = (lyext_substmt *)((long)pvVar14 + (ulong)uVar24 * 8);
                        }
                        plVar20 = (lyext_substmt *)lyxml_get_attr(node,"value",(char *)0x0);
                        if (plVar20 == (lyext_substmt *)0x0) goto LAB_00132424;
                        info = (lyext_substmt *)strtoll((char *)plVar20,(char **)0x0,10);
                        if ((ulong)info >> 0x20 != 0) goto LAB_0013243c;
                        type_00 = LYEXT_SUBSTMT_POSITION;
                        goto LAB_0013164b;
                      }
                      goto LAB_0013240b;
                    }
                    iVar5 = strcmp(pcVar13,"module");
                    if (iVar5 == 0) {
                      ppvVar12 = yin_getplace_for_extcomplex_struct
                                           (node,(lys_ext_instance_complex *)local_40,LY_STMT_MODULE
                                           );
                      if (ppvVar12 == (void **)0x0) {
                        return 1;
                      }
                      plVar11 = yin_read_module_(mod->ctx,node,(char *)0x0,
                                                 *(uint *)&mod->field_0x40 >> 7 & 1);
                      *ppvVar12 = plVar11;
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"when");
                    if (iVar5 == 0) {
                      plVar20 = (lyext_substmt *)
                                lys_ext_complex_get_substmt
                                          (LY_STMT_WHEN,(lys_ext_instance_complex *)local_40,
                                           &local_68);
                      if (plVar20 != (lyext_substmt *)0x0) {
                        pvVar14 = *(void **)plVar20;
                        if (local_68->cardinality < LY_STMT_CARD_SOME) {
                          if (pvVar14 != (void *)0x0) goto LAB_00132454;
                          local_38 = (lyext_substmt *)0x0;
                          uVar24 = 0;
                          plVar23 = plVar20;
                        }
                        else {
                          if (pvVar14 == (void *)0x0) {
                            pvVar14 = malloc(0x10);
                            *(void **)plVar20 = pvVar14;
                            if (pvVar14 == (void *)0x0) goto LAB_001323f2;
                            uVar24 = 0;
                          }
                          else {
                            lVar25 = 0;
                            do {
                              lVar1 = lVar25 * 8;
                              lVar25 = lVar25 + 1;
                            } while (*(long *)((long)pvVar14 + lVar1) != 0);
                            uVar24 = (int)lVar25 - 1;
                          }
                          plVar23 = (lyext_substmt *)((long)pvVar14 + (ulong)uVar24 * 8);
                          local_38 = plVar20;
                        }
                        plVar9 = read_yin_when(mod,node,local_48);
                        *(lys_when **)plVar23 = plVar9;
                        if (plVar9 == (lys_when *)0x0) {
                          return 1;
                        }
                        if (local_38 == (lyext_substmt *)0x0) goto LAB_00130c1a;
                        lVar25 = (long)(int)uVar24;
                        pvVar14 = realloc(*(void **)local_38,lVar25 * 8 + 0x10);
                        local_80 = local_38;
joined_r0x00131a2e:
                        if (pvVar14 == (void *)0x0) goto LAB_001323f2;
LAB_001316a7:
                        *(void **)local_80 = pvVar14;
                        *(undefined8 *)((long)pvVar14 + lVar25 * 8 + 8) = 0;
                        goto LAB_00130c1a;
                      }
                      goto LAB_0013240b;
                    }
                    iVar5 = strcmp(pcVar13,"revision");
                    if (iVar5 == 0) {
                      local_50 = (lyext_substmt *)
                                 lys_ext_complex_get_substmt
                                           (LY_STMT_REVISION,(lys_ext_instance_complex *)local_40,
                                            &local_68);
                      if (local_50 != (lyext_substmt *)0x0) {
                        pvVar14 = *(void **)local_50;
                        if (local_68->cardinality < LY_STMT_CARD_SOME) {
                          if (pvVar14 != (void *)0x0) goto LAB_00132454;
                          info = (lyext_substmt *)0x0;
                          local_38 = (lyext_substmt *)0x0;
                        }
                        else {
                          if (pvVar14 == (void *)0x0) {
                            pvVar14 = malloc(0x10);
                            *(void **)local_50 = pvVar14;
                            if (pvVar14 == (void *)0x0) goto LAB_001323f2;
                            local_38 = (lyext_substmt *)0x0;
                          }
                          else {
                            local_38 = (lyext_substmt *)0x0;
                            do {
                              lVar25 = (long)local_38 * 8;
                              local_38 = (lyext_substmt *)((long)local_38 + 1);
                            } while (*(long *)((long)pvVar14 + lVar25) != 0);
                            local_38 = (lyext_substmt *)(ulong)((int)local_38 - 1);
                          }
                          info = local_50;
                          local_50 = (lyext_substmt *)((long)pvVar14 + (long)local_38 * 8);
                        }
                        rev = (lys_revision *)calloc(1,0x28);
                        *(lys_revision **)local_50 = rev;
                        if (rev == (lys_revision *)0x0) goto LAB_001323f2;
                        iVar5 = fill_yin_revision(mod,node,rev,local_48);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        if (info == (lyext_substmt *)0x0) goto LAB_00130c1a;
                        if (0 < (int)local_38) {
                          endptr = (char *)((ulong)local_38 & 0xffffffff);
                          pcVar13 = (char *)0x0;
                          do {
                            iVar5 = strcmp(*(char **)(*(long *)info + (long)pcVar13 * 8),
                                           *(char **)local_50);
                            if (iVar5 == 0) {
                              ly_log(mod->ctx,LY_LLWRN,LY_SUCCESS,
                                     "Module\'s revisions are not unique (%s).");
                            }
                            pcVar13 = pcVar13 + 1;
                          } while (endptr != pcVar13);
                        }
                        lVar25 = (long)(int)local_38;
                        pvVar14 = realloc(*(void **)info,lVar25 * 8 + 0x10);
                        local_80 = info;
                        goto joined_r0x00131a2e;
                      }
                      goto LAB_0013240b;
                    }
                    iVar5 = strcmp(pcVar13,"unique");
                    if (iVar5 == 0) {
                      plVar20 = (lyext_substmt *)
                                lys_ext_complex_get_substmt
                                          (LY_STMT_UNIQUE,(lys_ext_instance_complex *)local_40,
                                           &local_68);
                      if (plVar20 == (lyext_substmt *)0x0) goto LAB_0013240b;
                      pvVar14 = *(void **)plVar20;
                      if (local_68->cardinality < LY_STMT_CARD_SOME) {
                        if (pvVar14 != (void *)0x0) goto LAB_00132454;
                        local_38 = (lyext_substmt *)0x0;
                        uVar24 = 0;
                        plVar23 = plVar20;
                      }
                      else {
                        if (pvVar14 == (void *)0x0) {
                          pvVar14 = malloc(0x10);
                          *(void **)plVar20 = pvVar14;
                          if (pvVar14 == (void *)0x0) goto LAB_001323f2;
                          uVar24 = 0;
                        }
                        else {
                          lVar25 = 0;
                          do {
                            lVar1 = lVar25 * 8;
                            lVar25 = lVar25 + 1;
                          } while (*(long *)((long)pvVar14 + lVar1) != 0);
                          uVar24 = (int)lVar25 - 1;
                        }
                        plVar23 = (lyext_substmt *)((long)pvVar14 + (ulong)uVar24 * 8);
                        local_38 = plVar20;
                      }
                      unique = (lys_unique *)calloc(1,0x10);
                      *(lys_unique **)plVar23 = unique;
                      if (unique == (lys_unique *)0x0) goto LAB_001323f2;
                      iVar5 = fill_yin_unique(mod,local_40,node,unique,local_48);
                      if (iVar5 != 0) {
                        return 1;
                      }
                      iVar5 = lyp_yin_parse_subnode_ext
                                        (mod,local_40,LYEXT_PAR_EXTINST,node,LYEXT_SUBSTMT_UNIQUE,
                                         (uint8_t)uVar24,local_48);
                      if (iVar5 != 0) {
                        return 1;
                      }
                      if (local_38 == (lyext_substmt *)0x0) goto LAB_00130c1a;
                      lVar25 = (long)(int)uVar24;
                      pvVar14 = realloc(*(void **)local_38,lVar25 * 8 + 0x10);
                      local_80 = local_38;
                      if (pvVar14 == (void *)0x0) goto LAB_0013238f;
                      goto LAB_001316a7;
                    }
                    iVar5 = strcmp(pcVar13,"action");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,LY_STMT_ACTION
                                           );
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      plVar11 = (lys_module *)read_yin_rpc_action(mod,local_40,node,1,local_48);
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"anydata");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,
                                            LY_STMT_ANYDATA);
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      type = LYS_ANYDATA;
LAB_00131b91:
                      plVar11 = (lys_module *)read_yin_anydata(mod,local_40,node,type,1,local_48);
LAB_00131537:
                      if (plVar11 == (lys_module *)0x0) {
                        return 1;
                      }
                      goto LAB_00130c1a;
                    }
                    iVar5 = strcmp(pcVar13,"anyxml");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,LY_STMT_ANYXML
                                           );
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      type = LYS_ANYXML;
                      goto LAB_00131b91;
                    }
                    iVar5 = strcmp(pcVar13,"case");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,LY_STMT_CASE);
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      plVar11 = (lys_module *)read_yin_case(mod,local_40,node,1,local_48);
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"choice");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,LY_STMT_CHOICE
                                           );
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      plVar11 = (lys_module *)read_yin_choice(mod,local_40,node,1,local_48);
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"container");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,
                                            LY_STMT_CONTAINER);
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      plVar11 = (lys_module *)read_yin_container(mod,local_40,node,1,local_48);
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"grouping");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,
                                            LY_STMT_GROUPING);
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      plVar11 = (lys_module *)read_yin_grouping(mod,local_40,node,1,local_48);
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"output");
                    if (iVar5 == 0) {
                      LVar17 = LY_STMT_OUTPUT;
LAB_00131d7a:
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,LVar17);
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      plVar11 = (lys_module *)read_yin_input_output(mod,local_40,node,1,local_48);
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"input");
                    if (iVar5 == 0) {
                      LVar17 = LY_STMT_INPUT;
                      goto LAB_00131d7a;
                    }
                    iVar5 = strcmp(pcVar13,"leaf");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,LY_STMT_LEAF);
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      plVar11 = (lys_module *)read_yin_leaf(mod,local_40,node,1,local_48);
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"leaf-list");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,
                                            LY_STMT_LEAFLIST);
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      plVar11 = (lys_module *)read_yin_leaflist(mod,local_40,node,1,local_48);
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"list");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,LY_STMT_LIST);
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      plVar11 = (lys_module *)read_yin_list(mod,local_40,node,1,local_48);
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"notification");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,
                                            LY_STMT_NOTIFICATION);
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      plVar11 = (lys_module *)read_yin_notif(mod,local_40,node,1,local_48);
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"uses");
                    if (iVar5 == 0) {
                      pplVar10 = yin_getplace_for_extcomplex_node
                                           (node,(lys_ext_instance_complex *)local_40,LY_STMT_USES);
                      if (pplVar10 == (lys_node **)0x0) {
                        return 1;
                      }
                      plVar11 = (lys_module *)read_yin_uses(mod,local_40,node,1,local_48);
                      goto LAB_00131537;
                    }
                    iVar5 = strcmp(pcVar13,"length");
                    if (iVar5 == 0) {
                      local_38 = (lyext_substmt *)
                                 lys_ext_complex_get_substmt
                                           (LY_STMT_LENGTH,(lys_ext_instance_complex *)local_40,
                                            &local_68);
                      if (local_38 != (lyext_substmt *)0x0) {
                        pvVar14 = *(void **)local_38;
                        if (local_68->cardinality < LY_STMT_CARD_SOME) {
LAB_00131f0c:
                          if (pvVar14 != (void *)0x0) goto LAB_00132454;
                          local_50 = (lyext_substmt *)0x0;
                          uVar22 = 0;
                        }
                        else {
                          if (pvVar14 == (void *)0x0) {
LAB_00132037:
                            pvVar14 = malloc(0x10);
                            *(void **)local_38 = pvVar14;
                            if (pvVar14 == (void *)0x0) goto LAB_001323f2;
                            uVar22 = 0;
                          }
                          else {
                            lVar25 = 0;
                            do {
                              lVar1 = lVar25 * 8;
                              lVar25 = lVar25 + 1;
                            } while (*(long *)((long)pvVar14 + lVar1) != 0);
LAB_00131f91:
                            uVar22 = (ulong)((int)lVar25 - 1);
                          }
                          local_50 = local_38;
                          local_38 = (lyext_substmt *)((long)pvVar14 + uVar22 * 8);
                        }
                        uVar24 = (uint)uVar22;
                        pcVar13 = lyxml_get_attr(node,"value",(char *)0x0);
                        if (pcVar13 != (char *)0x0) {
                          pvVar14 = calloc(1,0x38);
                          *(void **)local_38 = pvVar14;
                          plVar19 = mod->ctx;
                          if (pvVar14 == (void *)0x0) goto LAB_001323a0;
                          pcVar13 = lydict_insert(plVar19,pcVar13,0);
                          **(undefined8 **)local_38 = pcVar13;
                          iVar5 = read_restr_substmt(mod,*(lys_restr **)local_38,node,local_48);
                          if (iVar5 != 0) {
                            return 1;
                          }
                          goto LAB_001317d5;
                        }
                        goto LAB_00132424;
                      }
                      goto LAB_0013240b;
                    }
                    iVar5 = strcmp(pcVar13,"must");
                    if (iVar5 == 0) {
                      ppvVar12 = yin_getplace_for_extcomplex_struct
                                           (node,(lys_ext_instance_complex *)local_40,LY_STMT_MUST);
                      if (ppvVar12 == (void **)0x0) {
                        return 1;
                      }
                      must = (lys_restr *)calloc(1,0x38);
                      *ppvVar12 = must;
                      if (must == (lys_restr *)0x0) goto LAB_0013238f;
                      iVar5 = fill_yin_must(mod,node,must,local_48);
                      goto LAB_00130bf6;
                    }
                    iVar5 = strcmp(pcVar13,"pattern");
                    if (iVar5 != 0) {
                      iVar5 = strcmp(pcVar13,"range");
                      if (iVar5 != 0) {
                        plVar19 = mod->ctx;
                        pLVar6 = ly_errno_glob_address();
                        ly_log(plVar19,LY_LLERR,*pLVar6,
                               "Extension\'s substatement \"%s\" not supported.");
                        goto LAB_00130c1a;
                      }
                      local_38 = (lyext_substmt *)
                                 lys_ext_complex_get_substmt
                                           (LY_STMT_RANGE,(lys_ext_instance_complex *)local_40,
                                            &local_68);
                      if (local_38 != (lyext_substmt *)0x0) {
                        pvVar14 = *(void **)local_38;
                        if (LY_STMT_CARD_MAND < local_68->cardinality) {
                          if (pvVar14 == (void *)0x0) goto LAB_00132037;
                          lVar25 = 0;
                          do {
                            lVar1 = lVar25 * 8;
                            lVar25 = lVar25 + 1;
                          } while (*(long *)((long)pvVar14 + lVar1) != 0);
                          goto LAB_00131f91;
                        }
                        goto LAB_00131f0c;
                      }
                      goto LAB_0013240b;
                    }
                    info = (lyext_substmt *)
                           lys_ext_complex_get_substmt
                                     (LY_STMT_PATTERN,(lys_ext_instance_complex *)local_40,&local_68
                                     );
                    if (info == (lyext_substmt *)0x0) goto LAB_0013240b;
                    pvVar14 = *(void **)info;
                    if (local_68->cardinality < LY_STMT_CARD_SOME) {
                      if (pvVar14 != (void *)0x0) goto LAB_00132454;
                      local_80 = (lyext_substmt *)0x0;
                      local_38 = (lyext_substmt *)0x0;
                    }
                    else {
                      if (pvVar14 == (void *)0x0) {
                        pvVar14 = malloc(0x10);
                        *(void **)info = pvVar14;
                        if (pvVar14 == (void *)0x0) goto LAB_001323f2;
                        local_38 = (lyext_substmt *)0x0;
                      }
                      else {
                        local_38 = (lyext_substmt *)0x0;
                        do {
                          lVar25 = (long)local_38 * 8;
                          local_38 = (lyext_substmt *)((long)local_38 + 1);
                        } while (*(long *)((long)pvVar14 + lVar25) != 0);
                        local_38 = (lyext_substmt *)(ulong)((int)local_38 - 1);
                      }
                      local_80 = info;
                      info = (lyext_substmt *)((long)pvVar14 + (long)local_38 * 8);
                    }
                    endptr = lyxml_get_attr(node,"value",(char *)0x0);
                    plVar19 = mod->ctx;
                    if (endptr != (char *)0x0) {
                      iVar5 = lyp_check_pattern(plVar19,endptr,(pcre **)0x0);
                      if (iVar5 != 0) {
                        return 1;
                      }
                      local_50 = (lyext_substmt *)calloc(1,0x38);
                      *(lyext_substmt **)info = local_50;
                      if (local_50 == (lyext_substmt *)0x0) goto LAB_0013238f;
                      local_51 = 6;
                      if (((mod->field_0x40 & 0xc) != 0) &&
                         (elem = node->child, elem != (lyxml_elem *)0x0)) {
                        local_51 = 6;
                        local_50 = (lyext_substmt *)0x0;
                        do {
                          if (((elem->ns != (lyxml_ns *)0x0) &&
                              (iVar5 = strcmp(elem->ns->value,"urn:ietf:params:xml:ns:yang:yin:1"),
                              iVar5 == 0)) && (iVar5 = strcmp(elem->name,"modifier"), iVar5 == 0)) {
                            if (local_50 != (lyext_substmt *)0x0) {
                              plVar19 = mod->ctx;
                              pcVar21 = node->name;
                              pcVar13 = "modifier";
                              LVar18 = LYE_TOOMANY;
                              goto LAB_001323e9;
                            }
                            local_50 = (lyext_substmt *)lyxml_get_attr(elem,"value",(char *)0x0);
                            if (local_50 == (lyext_substmt *)0x0) {
                              plVar19 = mod->ctx;
                              pcVar21 = elem->name;
                              goto LAB_001323c4;
                            }
                            iVar5 = strcmp((char *)local_50,"invert-match");
                            if (iVar5 != 0) {
                              plVar19 = mod->ctx;
                              pcVar21 = "modifier";
                              LVar18 = LYE_INARG;
                              pcVar13 = (char *)local_50;
                              goto LAB_001323e9;
                            }
                            iVar5 = lyp_yin_parse_subnode_ext
                                              (mod,*(void **)info,LYEXT_PAR_RESTR,elem,
                                               LYEXT_SUBSTMT_MODIFIER,'\0',local_48);
                            local_51 = 0x15;
                            if (iVar5 != 0) {
                              return 1;
                            }
                          }
                          elem = elem->next;
                        } while (elem != (lyxml_elem *)0x0);
                        local_50 = *(lyext_substmt **)info;
                      }
                      sVar15 = strlen(endptr);
                      pvVar14 = malloc(sVar15 + 2);
                      plVar20 = info;
                      *(void **)local_50 = pvVar14;
                      if ((undefined1 *)**(long **)info == (undefined1 *)0x0) goto LAB_001323f2;
                      *(undefined1 *)**(long **)info = local_51;
                      strcpy((char *)(**(long **)info + 1),endptr);
                      lydict_insert_zc(mod->ctx,(char *)**(undefined8 **)plVar20);
                      iVar5 = read_restr_substmt(mod,*(lys_restr **)plVar20,node,local_48);
                      if (iVar5 != 0) {
                        return 1;
                      }
                      if (local_80 == (lyext_substmt *)0x0) goto LAB_00130c1a;
                      lVar25 = (long)(int)local_38;
                      pvVar14 = realloc(*(void **)local_80,lVar25 * 8 + 0x10);
                      goto joined_r0x00131a2e;
                    }
                  }
                  pcVar13 = node->name;
                  plVar20 = (lyext_substmt *)0x1b9564;
                  LVar18 = LYE_MISSARG;
LAB_00132370:
                  ly_vlog(plVar19,LVar18,LY_VLOG_NONE,(void *)0x0,plVar20,pcVar13);
                  return 1;
                }
                LVar17 = LY_STMT_MODIFIER;
                pcVar13 = "invert-match";
                pcVar21 = (char *)0x0;
              }
              iVar5 = yin_parse_extcomplex_bool
                                (mod,node,(lys_ext_instance_complex *)local_40,LVar17,pcVar13,
                                 pcVar21,local_48);
              goto LAB_001306b3;
            }
            LVar17 = LY_STMT_ORGANIZATION;
            ext = (lys_ext_instance_complex *)local_40;
          }
          goto LAB_00130be4;
        }
        LVar17 = LY_STMT_ARGUMENT;
        iVar5 = 0;
        pcVar13 = "name";
        goto LAB_00130bf1;
      }
      ppvVar12 = yin_getplace_for_extcomplex_struct(node,ext,LY_STMT_TYPEDEF);
      if (ppvVar12 == (void **)0x0) {
        return 1;
      }
      tpdf = (lys_tpdf *)calloc(1,0x80);
      *ppvVar12 = tpdf;
      if (tpdf == (lys_tpdf *)0x0) {
LAB_0013238f:
        plVar19 = mod->ctx;
        goto LAB_001323a0;
      }
      iVar5 = fill_yin_typedef(mod,local_40,node,tpdf,local_48);
      goto LAB_00130bf6;
    }
    ppvVar12 = yin_getplace_for_extcomplex_struct(node,ext,LY_STMT_TYPE);
    if (ppvVar12 == (void **)0x0) {
      return 1;
    }
    pvVar14 = calloc(1,0x40);
    *ppvVar12 = pvVar14;
    plVar19 = mod->ctx;
    if (pvVar14 == (void *)0x0) goto LAB_001323a0;
    lyxml_unlink(plVar19,node);
    *(lyxml_elem **)((long)*ppvVar12 + 0x10) = node;
    *(lys_node **)((long)*ppvVar12 + 0x18) = local_40;
    iVar5 = unres_schema_add_node(mod,local_48,*ppvVar12,UNRES_TYPE_DER_EXT,(lys_node *)0x0);
    node = plVar2;
    ext = (lys_ext_instance_complex *)local_40;
    if (iVar5 == -1) {
      *(undefined8 *)((long)*ppvVar12 + 0x10) = 0;
      return 1;
    }
  } while( true );
}

Assistant:

int
lyp_yin_parse_complex_ext(struct lys_module *mod, struct lys_ext_instance_complex *ext, struct lyxml_elem *yin,
                          struct unres_schema *unres)
{
    struct lyxml_elem *next, *node, *child;
    struct lys_type **type;
    void **pp, *p, *reallocated;
    const char *value, *name;
    char *endptr, modifier;
    struct lyext_substmt *info;
    long int v;
    long long int ll;
    unsigned long u;
    int i, j;

#define YIN_STORE_VALUE(TYPE, FROM, TO)           \
    *(TYPE **)TO = malloc(sizeof(TYPE));          \
    if (!*(TYPE **)TO) { LOGMEM(mod->ctx); goto error; }    \
    (**(TYPE **)TO) = (TYPE)FROM;

#define YIN_EXTCOMPLEX_GETPLACE(STMT, TYPE)                                          \
    p = lys_ext_complex_get_substmt(STMT, ext, &info);                               \
    if (!p) {                                                                        \
        LOGVAL(mod->ctx, LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, node->name, node->parent->name); \
        goto error;                                                                  \
    }                                                                                \
    if (info->cardinality < LY_STMT_CARD_SOME && (*(TYPE*)p)) {                      \
        LOGVAL(mod->ctx, LYE_TOOMANY, LY_VLOG_NONE, NULL, node->name, node->parent->name);     \
        goto error;                                                                  \
    }                                                                                \
    pp = NULL; i = 0;                                                                \
    if (info->cardinality >= LY_STMT_CARD_SOME) {                                    \
        /* there can be multiple instances */                                        \
        pp = p;                                                                      \
        if (!(*pp)) {                                                                \
            *pp = malloc(2 * sizeof(TYPE)); /* allocate initial array */             \
            LY_CHECK_ERR_GOTO(!*pp, LOGMEM(mod->ctx), error);                        \
        } else {                                                                     \
            for (i = 0; (*(TYPE**)pp)[i]; i++);                                      \
        }                                                                            \
        p = &(*(TYPE**)pp)[i];                                                       \
    }